

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<int> * __thiscall vector<int>::operator=(vector<int> *this,vector<int> *other)

{
  undefined1 auVar1 [16];
  ulong __n;
  int *piVar2;
  int local_1c;
  vector<int> *pvStack_18;
  int i;
  vector<int> *other_local;
  vector<int> *this_local;
  
  this->_size = other->_size;
  this->_capacity = other->_capacity;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->_capacity;
  __n = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  pvStack_18 = other;
  other_local = this;
  piVar2 = (int *)operator_new__(__n);
  memset(piVar2,0,__n);
  this->vect = piVar2;
  for (local_1c = 0; local_1c < this->_size; local_1c = local_1c + 1) {
    piVar2 = operator[](pvStack_18,&local_1c);
    this->vect[local_1c] = *piVar2;
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }